

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  U32 UVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  BYTE *pBVar8;
  U32 UVar9;
  int *mEnd;
  uint uVar10;
  uint uVar11;
  BYTE *pBVar12;
  int iVar13;
  int *piVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  int *ip;
  int *piVar20;
  seqDef *psVar21;
  uint local_104;
  size_t ofbCandidate;
  BYTE *local_f8;
  ulong local_f0;
  ulong local_e8;
  int *local_e0;
  ulong local_d8;
  int local_d0;
  uint local_cc;
  U32 *local_c8;
  seqStore_t *local_c0;
  BYTE *local_b8;
  ZSTD_matchState_t *local_b0;
  BYTE *local_a8;
  int *local_a0;
  int *local_98;
  U32 maxDistance;
  int *local_88;
  uint local_7c;
  int *local_78;
  BYTE *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_f8 = (ms->window).base;
  local_a8 = (ms->window).dictBase;
  uVar17 = (ms->window).dictLimit;
  local_f0 = (ulong)uVar17;
  local_a0 = (int *)(local_a8 + local_f0);
  local_70 = local_a8 + (ms->window).lowLimit;
  uVar4 = (ms->cParams).windowLog;
  uVar11 = (ms->cParams).minMatch;
  uVar10 = 6;
  if (uVar11 < 6) {
    uVar10 = uVar11;
  }
  local_cc = 4;
  if (4 < uVar10) {
    local_cc = uVar10;
  }
  uVar11 = *rep;
  local_104 = rep[1];
  ms->lazySkipping = 0;
  local_b8 = local_f8 + local_f0;
  uVar4 = 1 << ((byte)uVar4 & 0x1f);
  _maxDistance = (ulong)uVar4;
  iVar5 = (int)local_f8;
  local_60 = (ulong)(1 - (uVar4 + iVar5));
  piVar14 = (int *)((ulong)(local_b8 == (BYTE *)src) + (long)src);
  iEnd = (int *)((long)src + srcSize);
  local_88 = (int *)((long)src + (srcSize - 8));
  local_78 = (int *)((long)src + (srcSize - 0x20));
  local_58 = (ulong)(1 - iVar5);
  local_d0 = uVar17 - 1;
  local_68 = (ulong)((uVar17 - 2) + iVar5);
  uVar19 = (ulong)uVar11;
  local_c0 = seqStore;
  local_b0 = ms;
  piVar20 = (int *)src;
  pBVar8 = local_f8;
LAB_001cc2a7:
  do {
    local_98 = piVar20;
    local_e8 = uVar19;
    uVar17 = (uint)local_e8;
    if (local_88 <= piVar14) {
      *rep = uVar17;
      rep[1] = local_104;
      return (long)iEnd - (long)local_98;
    }
    iVar13 = (int)piVar14;
    iVar5 = (iVar13 - (int)pBVar8) + 1;
    UVar2 = (ms->window).lowLimit;
    UVar9 = iVar5 - (uint)_maxDistance;
    if (iVar5 - UVar2 <= (uint)_maxDistance) {
      UVar9 = UVar2;
    }
    if (ms->loadedDictEnd != 0) {
      UVar9 = UVar2;
    }
    uVar11 = iVar5 - uVar17;
    pBVar12 = local_a8;
    if ((uint)local_f0 <= uVar11) {
      pBVar12 = pBVar8;
    }
    local_e0 = (int *)((long)piVar14 + 1);
    if (local_d0 - uVar11 < 3) {
LAB_001cc34e:
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      if (uVar17 <= iVar5 - UVar9) {
        if (*local_e0 != *(int *)(pBVar12 + uVar11)) goto LAB_001cc34e;
        piVar20 = local_a0;
        if ((uint)local_f0 <= uVar11) {
          piVar20 = iEnd;
        }
        sVar6 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar14 + 5),(BYTE *)((long)(pBVar12 + uVar11) + 4),
                           (BYTE *)iEnd,(BYTE *)piVar20,local_b8);
        uVar19 = sVar6 + 4;
      }
    }
    ofbCandidate = 999999999;
    if (local_cc == 6) {
      uVar7 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar14,(BYTE *)iEnd,&ofbCandidate);
    }
    else if (local_cc == 5) {
      uVar7 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar14,(BYTE *)iEnd,&ofbCandidate);
    }
    else {
      uVar7 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar14,(BYTE *)iEnd,&ofbCandidate);
    }
    uVar18 = uVar19;
    if (uVar19 < uVar7) {
      uVar18 = uVar7;
    }
    if (uVar18 < 4) {
      uVar19 = (long)piVar14 - (long)local_98;
      piVar14 = (int *)((long)piVar14 + (uVar19 >> 8) + 1);
      ms->lazySkipping = (uint)(0x8ff < uVar19);
      uVar19 = local_e8;
      piVar20 = local_98;
      goto LAB_001cc2a7;
    }
    uVar16 = 1;
    if (uVar19 < uVar7) {
      local_e0 = piVar14;
      uVar16 = ofbCandidate;
    }
    local_40 = (ulong)(uint)((int)local_60 + iVar13);
    local_48 = (ulong)(uint)((int)local_58 + iVar13);
    uVar17 = ((int)local_68 + (int)local_e8) - iVar13;
    local_50 = (ulong)(uint)(((int)local_58 - (int)local_e8) + iVar13);
    lVar15 = 0;
    piVar20 = piVar14;
    local_c8 = rep;
    while (uVar19 = uVar16, (int *)((long)piVar14 + lVar15) < local_88) {
      ip = (int *)((long)piVar14 + lVar15 + 1);
      local_7c = uVar17;
      local_38 = lVar15;
      if (uVar16 == 0) {
        uVar16 = 0;
      }
      else {
        UVar2 = (ms->window).lowLimit;
        iVar13 = (int)lVar15;
        iVar5 = (int)local_48 + iVar13;
        UVar9 = (int)local_40 + iVar13;
        if (iVar5 - UVar2 <= maxDistance) {
          UVar9 = UVar2;
        }
        if (ms->loadedDictEnd != 0) {
          UVar9 = UVar2;
        }
        uVar11 = (int)local_50 + iVar13;
        if (uVar11 < (uint)local_f0) {
          pBVar8 = local_a8;
        }
        if (((2 < uVar17) && ((uint)local_e8 <= iVar5 - UVar9)) &&
           (*ip == *(int *)(pBVar8 + uVar11))) {
          mEnd = iEnd;
          if (uVar11 < (uint)local_f0) {
            mEnd = local_a0;
          }
          sVar6 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar14 + lVar15 + 5),
                             (BYTE *)((long)(pBVar8 + uVar11) + 4),(BYTE *)iEnd,(BYTE *)mEnd,
                             local_b8);
          local_d8 = uVar16;
          uVar17 = ZSTD_highbit32((U32)uVar16);
          uVar16 = local_d8;
          if ((sVar6 < 0xfffffffffffffffc) &&
             ((int)(((int)uVar18 * 3 - uVar17) + 1) < (int)(sVar6 + 4) * 3)) {
            uVar16 = 1;
            uVar18 = sVar6 + 4;
            local_e0 = ip;
          }
        }
      }
      ofbCandidate = 999999999;
      local_d8 = uVar16;
      if (local_cc == 6) {
        uVar7 = ZSTD_HcFindBestMatch_extDict_6(local_b0,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (local_cc == 5) {
        uVar7 = ZSTD_HcFindBestMatch_extDict_5(local_b0,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar7 = ZSTD_HcFindBestMatch_extDict_4(local_b0,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      uVar16 = ofbCandidate;
      uVar17 = ZSTD_highbit32((U32)ofbCandidate);
      uVar11 = ZSTD_highbit32((U32)local_d8);
      pBVar8 = local_f8;
      uVar19 = local_d8;
      ms = local_b0;
      if ((uVar7 < 4) || ((int)((int)uVar7 * 4 - uVar17) <= (int)(((int)uVar18 * 4 - uVar11) + 4)))
      break;
      piVar20 = (int *)((long)piVar20 + 1);
      uVar17 = local_7c - 1;
      uVar18 = uVar7;
      local_e0 = piVar20;
      lVar15 = local_38 + 1;
    }
    piVar14 = local_e0;
    if (3 < uVar19) {
      uVar7 = (long)local_e0 + (-(long)pBVar8 - uVar19) + 3;
      pBVar12 = local_b8;
      if ((uint)uVar7 < (uint)local_f0) {
        pBVar12 = local_70;
        pBVar8 = local_a8;
      }
      pBVar8 = pBVar8 + (uVar7 & 0xffffffff);
      for (; ((local_98 < piVar14 && (pBVar12 < pBVar8)) &&
             (*(BYTE *)((long)piVar14 + -1) == pBVar8[-1])); piVar14 = (int *)((long)piVar14 + -1))
      {
        pBVar8 = pBVar8 + -1;
        uVar18 = uVar18 + 1;
      }
      local_104 = (uint)local_e8;
      local_e8 = (ulong)((U32)uVar19 - 3);
    }
    if (local_c0->maxNbSeq <=
        (ulong)((long)local_c0->sequences - (long)local_c0->sequencesStart >> 3)) {
LAB_001cc9f3:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < local_c0->maxNbLit) {
LAB_001cca12:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar7 = (long)piVar14 - (long)local_98;
    pBVar8 = local_c0->lit;
    if (local_c0->litStart + local_c0->maxNbLit < pBVar8 + uVar7) {
LAB_001cca50:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < piVar14) {
LAB_001cca6f:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_78 < piVar14) {
      ZSTD_safecopyLiterals(pBVar8,(BYTE *)local_98,(BYTE *)piVar14,(BYTE *)local_78);
LAB_001cc724:
      local_c0->lit = local_c0->lit + uVar7;
      if (0xffff < uVar7) {
        if (local_c0->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_c0->longLengthType = ZSTD_llt_literalLength;
        local_c0->longLengthPos =
             (U32)((ulong)((long)local_c0->sequences - (long)local_c0->sequencesStart) >> 3);
      }
    }
    else {
      uVar3 = *(undefined8 *)(local_98 + 2);
      *(undefined8 *)pBVar8 = *(undefined8 *)local_98;
      *(undefined8 *)(pBVar8 + 8) = uVar3;
      pBVar8 = local_c0->lit;
      if (0x10 < uVar7) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar8 + 0x10 + (-0x10 - (long)(local_98 + 4))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar3 = *(undefined8 *)(local_98 + 6);
        *(undefined8 *)(pBVar8 + 0x10) = *(undefined8 *)(local_98 + 4);
        *(undefined8 *)(pBVar8 + 0x18) = uVar3;
        if (0x20 < (long)uVar7) {
          lVar15 = 0;
          do {
            puVar1 = (undefined8 *)((long)local_98 + lVar15 + 0x20);
            uVar3 = puVar1[1];
            pBVar12 = pBVar8 + lVar15 + 0x20;
            *(undefined8 *)pBVar12 = *puVar1;
            *(undefined8 *)(pBVar12 + 8) = uVar3;
            puVar1 = (undefined8 *)((long)local_98 + lVar15 + 0x30);
            uVar3 = puVar1[1];
            *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar12 + 0x18) = uVar3;
            lVar15 = lVar15 + 0x20;
          } while (pBVar12 + 0x20 < pBVar8 + uVar7);
        }
        goto LAB_001cc724;
      }
      local_c0->lit = pBVar8 + uVar7;
    }
    psVar21 = local_c0->sequences;
    psVar21->litLength = (U16)uVar7;
    psVar21->offBase = (U32)uVar19;
    if (uVar18 < 3) {
LAB_001cca31:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar18 - 3) {
      if (local_c0->longLengthType != ZSTD_llt_none) {
LAB_001cca8e:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_c0->longLengthType = ZSTD_llt_matchLength;
      local_c0->longLengthPos = (U32)((ulong)((long)psVar21 - (long)local_c0->sequencesStart) >> 3);
    }
    psVar21->mlBase = (U16)(uVar18 - 3);
    psVar21 = psVar21 + 1;
    local_c0->sequences = psVar21;
    if (ms->lazySkipping != 0) {
      ms->lazySkipping = 0;
    }
    uVar7 = (ulong)local_104;
    uVar19 = local_e8;
    for (piVar14 = (int *)((long)piVar14 + uVar18); uVar18 = uVar7, local_104 = (uint)uVar18,
        piVar20 = piVar14, pBVar8 = local_f8, rep = local_c8, piVar14 <= local_88;
        piVar14 = (int *)((long)piVar14 + sVar6 + 4)) {
      iVar5 = (int)piVar14 - (int)local_f8;
      UVar2 = (ms->window).lowLimit;
      UVar9 = iVar5 - (uint)_maxDistance;
      if (iVar5 - UVar2 <= (uint)_maxDistance) {
        UVar9 = UVar2;
      }
      if (ms->loadedDictEnd != 0) {
        UVar9 = UVar2;
      }
      uVar17 = iVar5 - local_104;
      pBVar12 = local_f8;
      if (uVar17 < (uint)local_f0) {
        pBVar12 = local_a8;
      }
      if (((local_d0 - uVar17 < 3) || (iVar5 - UVar9 < local_104)) ||
         (*piVar14 != *(int *)(pBVar12 + uVar17))) break;
      piVar20 = iEnd;
      if (uVar17 < (uint)local_f0) {
        piVar20 = local_a0;
      }
      sVar6 = ZSTD_count_2segments
                        ((BYTE *)(piVar14 + 1),(BYTE *)((long)(pBVar12 + uVar17) + 4),(BYTE *)iEnd,
                         (BYTE *)piVar20,local_b8);
      if (local_c0->maxNbSeq <= (ulong)((long)psVar21 - (long)local_c0->sequencesStart >> 3))
      goto LAB_001cc9f3;
      if (0x20000 < local_c0->maxNbLit) goto LAB_001cca12;
      pBVar8 = local_c0->lit;
      if (local_c0->litStart + local_c0->maxNbLit < pBVar8) goto LAB_001cca50;
      if (iEnd < piVar14) goto LAB_001cca6f;
      if (local_78 < piVar14) {
        ZSTD_safecopyLiterals(pBVar8,(BYTE *)piVar14,(BYTE *)piVar14,(BYTE *)local_78);
      }
      else {
        uVar3 = *(undefined8 *)(piVar14 + 2);
        *(undefined8 *)pBVar8 = *(undefined8 *)piVar14;
        *(undefined8 *)(pBVar8 + 8) = uVar3;
      }
      psVar21 = local_c0->sequences;
      psVar21->litLength = 0;
      psVar21->offBase = 1;
      if (sVar6 + 4 < 3) goto LAB_001cca31;
      if (0xffff < sVar6 + 1) {
        if (local_c0->longLengthType != ZSTD_llt_none) goto LAB_001cca8e;
        local_c0->longLengthType = ZSTD_llt_matchLength;
        local_c0->longLengthPos =
             (U32)((ulong)((long)psVar21 - (long)local_c0->sequencesStart) >> 3);
      }
      psVar21->mlBase = (U16)(sVar6 + 1);
      psVar21 = psVar21 + 1;
      local_c0->sequences = psVar21;
      uVar7 = uVar19 & 0xffffffff;
      uVar19 = uVar18;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}